

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<tinyusdz::value::matrix4f> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<tinyusdz::value::matrix4f>
          (optional<tinyusdz::value::matrix4f> *__return_storage_ptr__,PrimVar *this)

{
  optional<tinyusdz::value::matrix4f> local_5c;
  PrimVar *local_18;
  PrimVar *this_local;
  
  local_18 = this;
  this_local = (PrimVar *)__return_storage_ptr__;
  get_value<tinyusdz::value::matrix4f>(&local_5c,this);
  nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::optional<tinyusdz::value::matrix4f,_0>
            (__return_storage_ptr__,&local_5c);
  nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::~optional(&local_5c);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }